

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

map * config_initialize_path(char *path)

{
  natwm_error nVar1;
  int iVar2;
  map *pmVar3;
  map *config;
  char *file_buffer;
  size_t file_size;
  FILE *file;
  char *path_local;
  
  file = (FILE *)path;
  file_size = (size_t)open_config_file(path);
  if ((FILE *)file_size != (FILE *)0x0) {
    file_buffer = (char *)0x0;
    nVar1 = get_file_size((FILE *)file_size,(size_t *)&file_buffer);
    if (nVar1 == NO_ERROR) {
      config = (map *)0x0;
      iVar2 = read_file_into_buffer((FILE *)file_size,(char **)&config,(size_t)file_buffer);
      if (iVar2 == 0) {
        pmVar3 = config_read_string((char *)config,(size_t)file_buffer);
        if (pmVar3 != (map *)0x0) {
          free(config);
          fclose((FILE *)file_size);
          return pmVar3;
        }
        free(config);
      }
    }
    fclose((FILE *)file_size);
  }
  return (map *)0x0;
}

Assistant:

struct map *config_initialize_path(const char *path)
{
        FILE *file = open_config_file(path);

        if (file == NULL) {
                return NULL;
        }

        size_t file_size = 0;

        if (get_file_size(file, &file_size) != NO_ERROR) {
                goto close_file_and_error;
        }

        char *file_buffer = NULL;

        if (read_file_into_buffer(file, &file_buffer, file_size) != 0) {
                goto close_file_and_error;
        }

        struct map *config = config_read_string(file_buffer, file_size);

        if (config == NULL) {
                free(file_buffer);

                goto close_file_and_error;
        }

        free(file_buffer);
        fclose(file);

        return config;

close_file_and_error:
        fclose(file);

        return NULL;
}